

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  int *piVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  uint *puVar3;
  undefined8 uVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SPxId *pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  type_conflict5 tVar11;
  int iVar12;
  int iVar13;
  double *pdVar14;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  cpp_dec_float<50u,int,void> *this_00;
  pointer pnVar17;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *u;
  long lVar18;
  ulong uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int *local_250;
  cpp_dec_float<50U,_int,_void> local_248;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_210;
  int *local_208;
  int local_1fc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> *local_180;
  undefined4 local_174;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_170;
  pointer local_168;
  long local_160;
  Type local_154;
  pointer local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  cpp_dec_float<50U,_int,_void> local_108;
  fpclass_type *local_d0;
  fpclass_type *local_c8;
  cpp_dec_float<50u,int,void> *local_c0;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems._24_5_ = 0;
  local_108.data._M_elems[7]._1_3_ = 0;
  local_108.data._M_elems._32_5_ = 0;
  local_108.data._M_elems[9]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 10;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems._24_5_ = 0;
  local_b8.data._M_elems[7]._1_3_ = 0;
  local_b8.data._M_elems._32_5_ = 0;
  local_b8.data._M_elems[9]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems._24_5_ = 0;
  local_78.data._M_elems[7]._1_3_ = 0;
  local_78.data._M_elems._32_5_ = 0;
  local_78.data._M_elems[9]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  local_154 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_154 == LEAVE) {
    local_174 = 0;
  }
  else {
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_174 = (undefined4)CONCAT71((int7)((ulong)pSVar5 >> 8),pSVar5->theRep == ROW);
  }
  uVar4 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
  local_1b8.data._M_elems[8] = (uint)uVar4;
  local_1b8.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)(maxabs->m_backend).data._M_elems;
  uVar7 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
  uVar8 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
  uVar9 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
  local_1b8.data._M_elems[4] = (uint)uVar8;
  local_1b8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
  local_1b8.data._M_elems[6] = (uint)uVar9;
  local_1b8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
  local_1b8.data._M_elems[0] = (uint)uVar4;
  local_1b8.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
  local_1b8.data._M_elems[2] = (uint)uVar7;
  local_1b8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
  local_1b8.exp = (maxabs->m_backend).exp;
  local_1b8.neg = (maxabs->m_backend).neg;
  local_1b8.fpclass = (maxabs->m_backend).fpclass;
  local_1b8.prec_elem = (maxabs->m_backend).prec_elem;
  local_d0 = (fpclass_type *)
             (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (fpclass_type *)
             (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_150 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_250 = (update->thedelta).super_IdxSet.idx;
  pnVar17 = (update->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_148.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_148.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_148.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_148.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_148.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_148.m_backend.exp = (val->m_backend).exp;
  local_148.m_backend.neg = (val->m_backend).neg;
  local_148.m_backend.fpclass = (val->m_backend).fpclass;
  local_148.m_backend.prec_elem = (val->m_backend).prec_elem;
  local_210 = this;
  local_40 = val;
  local_38 = maxabs;
  if ((update->thedelta).setupStatus == true) {
    local_208 = local_250 + (update->thedelta).super_IdxSet.num;
    local_170 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&this->fastDelta;
    local_160 = (long)incr << 2;
    local_1fc = -1;
    local_168 = pnVar17;
    for (pcVar16 = (cpp_dec_float<50U,_int,_void> *)(local_250 + start); pcVar16 < local_208;
        pcVar16 = (cpp_dec_float<50U,_int,_void> *)((long)pcVar16 + local_160)) {
      iVar13 = *(int *)pcVar16;
      uVar4 = *(undefined8 *)((long)&pnVar17[iVar13].m_backend.data + 0x20);
      local_248.data._M_elems[8] = (uint)uVar4;
      local_248.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)&pnVar17[iVar13].m_backend.data;
      uVar7 = *(undefined8 *)((long)&pnVar17[iVar13].m_backend.data + 8);
      puVar3 = (uint *)((long)&pnVar17[iVar13].m_backend.data + 0x10);
      uVar8 = *(undefined8 *)puVar3;
      uVar9 = *(undefined8 *)(puVar3 + 2);
      local_248.data._M_elems[4] = (uint)uVar8;
      local_248.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
      local_248.data._M_elems[6] = (uint)uVar9;
      local_248.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
      local_248.data._M_elems[0] = (uint)uVar4;
      local_248.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
      local_248.data._M_elems[2] = (uint)uVar7;
      local_248.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
      local_248.exp = pnVar17[iVar13].m_backend.exp;
      local_248.neg = pnVar17[iVar13].m_backend.neg;
      local_248.fpclass = pnVar17[iVar13].m_backend.fpclass;
      local_248.prec_elem = pnVar17[iVar13].m_backend.prec_elem;
      if (local_154 == LEAVE) {
        pSVar5 = (local_210->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        if (local_210->iscoid == true) {
          pDVar15 = (pSVar5->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.costat;
        }
        else {
          pDVar15 = (pSVar5->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.stat;
        }
        if (pSVar5->theRep * pDVar15->data[iVar13] < 1) goto LAB_0027a0e9;
      }
      else {
LAB_0027a0e9:
        local_c0 = (cpp_dec_float<50u,int,void> *)CONCAT44(local_c0._4_4_,iVar13);
        if ((char)local_174 != '\0') {
          pSVar5 = (local_210->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar6[iVar13].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)&result,pSVar6 + iVar13);
            iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&result);
            pnVar17 = local_168;
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar12] == P_FIXED) goto LAB_0027a949;
          }
        }
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
        result.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
        result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.exp = (local_210->epsilon).m_backend.exp;
        result.m_backend.neg = (local_210->epsilon).m_backend.neg;
        result.m_backend.fpclass = (local_210->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (local_210->epsilon).m_backend.prec_elem;
        tVar11 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_248,&result);
        if (tVar11) {
          local_180 = pcVar16;
          tVar11 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_248,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1b8);
          pcVar16 = &local_1b8;
          if (tVar11) {
            pcVar16 = &local_248;
          }
          uVar4 = *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems;
          uVar7 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems + 2);
          uVar8 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems + 4);
          uVar9 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems + 6);
          local_1b8.data._M_elems[0] = (uint)uVar4;
          local_1b8.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
          local_1b8.data._M_elems[2] = (uint)uVar7;
          local_1b8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
          local_1b8.data._M_elems[4] = (uint)uVar8;
          local_1b8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
          local_1b8.data._M_elems[6] = (uint)uVar9;
          local_1b8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
          uVar4 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems + 8);
          local_1b8.data._M_elems[8] = (uint)uVar4;
          local_1b8.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
          pcVar16 = &local_1b8;
          if (tVar11) {
            pcVar16 = &local_248;
          }
          local_1b8.exp = pcVar16->exp;
          pcVar16 = &local_1b8;
          if (tVar11) {
            pcVar16 = &local_248;
          }
          local_1b8.neg = pcVar16->neg;
          uVar19 = CONCAT44((int)((uint)tVar11 << 0x1f) >> 0x1f,(int)((uint)tVar11 << 0x1f) >> 0x1f)
          ;
          local_1b8._48_8_ = ~uVar19 & local_1b8._48_8_ | local_248._48_8_ & uVar19;
          puVar3 = (uint *)((long)&(((pointer)((long)local_c8 + (long)iVar13 * 0x38))->m_backend).
                                   data + 0x10);
          local_78.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          uVar4 = *(undefined8 *)(puVar3 + 2);
          local_78.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          uVar4 = *(undefined8 *)
                   ((long)&(((pointer)((long)local_c8 + (long)iVar13 * 0x38))->m_backend).data +
                   0x20);
          local_78.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_78.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_78.data._M_elems._0_8_ =
               *(undefined8 *)&(((pointer)((long)local_c8 + (long)iVar13 * 0x38))->m_backend).data;
          local_78.data._M_elems._8_8_ =
               *(undefined8 *)
                ((long)&(((pointer)((long)local_c8 + (long)iVar13 * 0x38))->m_backend).data + 8);
          local_78.exp = (((pointer)((long)local_c8 + (long)iVar13 * 0x38))->m_backend).exp;
          local_78.neg = (((pointer)((long)local_c8 + (long)iVar13 * 0x38))->m_backend).neg;
          local_78.fpclass = (((pointer)((long)local_c8 + (long)iVar13 * 0x38))->m_backend).fpclass;
          local_78.prec_elem =
               (((pointer)((long)local_c8 + (long)iVar13 * 0x38))->m_backend).prec_elem;
          pdVar14 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,-*pdVar14,(type *)0x0);
          tVar11 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_78,&result);
          pcVar16 = local_180;
          pnVar17 = local_168;
          if (tVar11) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&local_78,&local_150[iVar13].m_backend);
            local_108.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
            local_108.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
            local_108.data._M_elems[4] = result.m_backend.data._M_elems[4];
            local_108.data._M_elems[5] = result.m_backend.data._M_elems[5];
            local_108.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
            local_108.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
            local_108.data._M_elems[0] = result.m_backend.data._M_elems[0];
            local_108.data._M_elems[1] = result.m_backend.data._M_elems[1];
            local_108.data._M_elems[2] = result.m_backend.data._M_elems[2];
            local_108.data._M_elems[3] = result.m_backend.data._M_elems[3];
            local_108.exp = result.m_backend.exp;
            local_108.neg = result.m_backend.neg;
            local_108.fpclass = result.m_backend.fpclass;
            local_108.prec_elem = result.m_backend.prec_elem;
            result.m_backend.data._M_elems._0_8_ =
                 result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar11 = boost::multiprecision::operator>=
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_108,(int *)&result);
            pnVar17 = local_168;
            pcVar16 = local_180;
            if (tVar11) {
              uVar4 = *(undefined8 *)
                       (((array_type *)
                        &local_170->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )->_M_elems + 8);
              result_1.m_backend.data._M_elems[8] = (uint)uVar4;
              result_1.m_backend.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
              result_1.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    ((array_type *)
                    &local_170->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )->_M_elems;
              result_1.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)
                    (((array_type *)
                     &local_170->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )->_M_elems + 2);
              result_1.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)
                    (((array_type *)
                     &local_170->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )->_M_elems + 4);
              uVar4 = *(undefined8 *)
                       (((array_type *)
                        &local_170->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )->_M_elems + 6);
              result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
              result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              result_1.m_backend.exp = (local_210->fastDelta).m_backend.exp;
              result_1.m_backend.neg = (local_210->fastDelta).m_backend.neg;
              result_1.m_backend.fpclass = (local_210->fastDelta).m_backend.fpclass;
              result_1.m_backend.prec_elem = (local_210->fastDelta).m_backend.prec_elem;
              if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
                  result_1.m_backend.data._M_elems[0] != 0) {
                result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
              }
            }
            else {
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems._24_5_ = 0;
              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_1.m_backend,&local_108,(cpp_dec_float<50U,_int,_void> *)local_170);
            }
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.neg = false;
            result.m_backend.exp = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&result_1.m_backend,&local_248);
            local_248.data._M_elems[8] = result.m_backend.data._M_elems[8];
            local_248.data._M_elems[9] =
                 (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                                 result.m_backend.data._M_elems._32_5_) >> 0x20);
            local_248.data._M_elems[4] = result.m_backend.data._M_elems[4];
            local_248.data._M_elems[5] = result.m_backend.data._M_elems[5];
            local_248.data._M_elems[6] = result.m_backend.data._M_elems[6];
            local_248.data._M_elems[7] =
                 (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                                 result.m_backend.data._M_elems._24_5_) >> 0x20);
            local_248.data._M_elems[0] = result.m_backend.data._M_elems[0];
            local_248.data._M_elems[1] = result.m_backend.data._M_elems[1];
            local_248.data._M_elems[2] = result.m_backend.data._M_elems[2];
            local_248.data._M_elems[3] = result.m_backend.data._M_elems[3];
            local_248.exp = result.m_backend.exp;
            local_248.neg = result.m_backend.neg;
            local_248.fpclass = result.m_backend.fpclass;
            local_248.prec_elem = result.m_backend.prec_elem;
            tVar11 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_248,&local_148);
            if (tVar11) {
LAB_0027a8ef:
              local_148.m_backend.data._M_elems[9] = local_248.data._M_elems[9];
              local_148.m_backend.data._M_elems[8] = local_248.data._M_elems[8];
              local_148.m_backend.data._M_elems[1] = local_248.data._M_elems[1];
              local_148.m_backend.data._M_elems[0] = local_248.data._M_elems[0];
              local_148.m_backend.data._M_elems[3] = local_248.data._M_elems[3];
              local_148.m_backend.data._M_elems[2] = local_248.data._M_elems[2];
              local_148.m_backend.data._M_elems[5] = local_248.data._M_elems[5];
              local_148.m_backend.data._M_elems[4] = local_248.data._M_elems[4];
              local_148.m_backend.data._M_elems[7] = local_248.data._M_elems[7];
              local_148.m_backend.data._M_elems[6] = local_248.data._M_elems[6];
              local_148.m_backend.exp = local_248.exp;
              local_148.m_backend.neg = local_248.neg;
              local_148.m_backend.fpclass = local_248.fpclass;
              local_148.m_backend.prec_elem = local_248.prec_elem;
              local_1fc = (int)local_c0;
            }
          }
        }
        else {
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
          result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
          result.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
          result.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
          result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result.m_backend.exp = (local_210->epsilon).m_backend.exp;
          result.m_backend.neg = (local_210->epsilon).m_backend.neg;
          result.m_backend.fpclass = (local_210->epsilon).m_backend.fpclass;
          result.m_backend.prec_elem = (local_210->epsilon).m_backend.prec_elem;
          if (result.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
          }
          tVar11 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_248,&result);
          pnVar17 = local_168;
          if (tVar11) {
            result.m_backend.data._M_elems[1] = local_248.data._M_elems[1];
            result.m_backend.data._M_elems[0] = local_248.data._M_elems[0];
            result.m_backend.data._M_elems[3] = local_248.data._M_elems[3];
            result.m_backend.data._M_elems[2] = local_248.data._M_elems[2];
            result.m_backend.data._M_elems[5] = local_248.data._M_elems[5];
            result.m_backend.data._M_elems[4] = local_248.data._M_elems[4];
            result.m_backend.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_248.data._M_elems[9],local_248.data._M_elems[8]),0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_248.data._M_elems[9] >> 8);
            result.m_backend.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_248.data._M_elems[7],local_248.data._M_elems[6]),0);
            result.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_248.data._M_elems[7] >> 8);
            result.m_backend.exp = local_248.exp;
            result.m_backend.neg = local_248.neg;
            result.m_backend.fpclass = local_248.fpclass;
            result.m_backend.prec_elem = local_248.prec_elem;
            if (local_248.fpclass != cpp_dec_float_finite || local_248.data._M_elems[0] != 0) {
              result.m_backend.neg = (bool)(local_248.neg ^ 1);
            }
            tVar11 = boost::multiprecision::operator>
                               (&result,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_1b8);
            if (tVar11) {
              result_1.m_backend.data._M_elems[1] = local_248.data._M_elems[2];
              result_1.m_backend.data._M_elems[0] = local_248.data._M_elems[1];
              result_1.m_backend.data._M_elems[3] = local_248.data._M_elems[4];
              result_1.m_backend.data._M_elems[2] = local_248.data._M_elems[3];
              result_1.m_backend.data._M_elems[5] = local_248.data._M_elems[6];
              result_1.m_backend.data._M_elems[4] = local_248.data._M_elems[5];
              result_1.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_248.data._M_elems[8],local_248.data._M_elems[7]),0);
              result_1.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_248.data._M_elems[8] >> 8);
              result_1.m_backend.data._M_elems[8] = local_248.data._M_elems[9];
              local_1b8.exp = local_248.exp;
              local_1b8.prec_elem = local_248.prec_elem;
              if (local_248.fpclass == cpp_dec_float_finite && local_248.data._M_elems[0] == 0) {
                local_1b8.neg = local_248.neg;
                local_1b8.data._M_elems[0] = 0;
                local_1b8.fpclass = cpp_dec_float_finite;
              }
              else {
                local_1b8.neg = (bool)(local_248.neg ^ 1);
                local_1b8.data._M_elems[0] = local_248.data._M_elems[0];
                local_1b8.fpclass = local_248.fpclass;
              }
            }
            else {
              result_1.m_backend.data._M_elems[1] = local_1b8.data._M_elems[2];
              result_1.m_backend.data._M_elems[0] = local_1b8.data._M_elems[1];
              result_1.m_backend.data._M_elems[3] = local_1b8.data._M_elems[4];
              result_1.m_backend.data._M_elems[2] = local_1b8.data._M_elems[3];
              result_1.m_backend.data._M_elems[5] = local_1b8.data._M_elems[6];
              result_1.m_backend.data._M_elems[4] = local_1b8.data._M_elems[5];
              result_1.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_1b8.data._M_elems[8],local_1b8.data._M_elems[7]),0);
              result_1.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_1b8.data._M_elems[8] >> 8);
              result_1.m_backend.data._M_elems[8] = local_1b8.data._M_elems[9];
            }
            local_1b8.data._M_elems[9] = result_1.m_backend.data._M_elems[8];
            local_1b8.data._M_elems[5] = result_1.m_backend.data._M_elems[4];
            local_1b8.data._M_elems[6] = result_1.m_backend.data._M_elems[5];
            local_1b8.data._M_elems[7] = result_1.m_backend.data._M_elems[6];
            local_1b8.data._M_elems[8] =
                 (uint)(CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                                 result_1.m_backend.data._M_elems._24_5_) >> 0x20);
            local_1b8.data._M_elems[1] = result_1.m_backend.data._M_elems[0];
            local_1b8.data._M_elems[2] = result_1.m_backend.data._M_elems[1];
            local_1b8.data._M_elems[3] = result_1.m_backend.data._M_elems[2];
            local_1b8.data._M_elems[4] = result_1.m_backend.data._M_elems[3];
            local_b8.data._M_elems._0_8_ =
                 *(undefined8 *)&(((pointer)((long)local_d0 + (long)iVar13 * 0x38))->m_backend).data
            ;
            local_b8.data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((long)&(((pointer)((long)local_d0 + (long)iVar13 * 0x38))->m_backend).data + 8);
            puVar3 = (uint *)((long)&(((pointer)((long)local_d0 + (long)iVar13 * 0x38))->m_backend).
                                     data + 0x10);
            local_b8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            uVar4 = *(undefined8 *)(puVar3 + 2);
            local_b8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            uVar4 = *(undefined8 *)
                     ((long)&(((pointer)((long)local_d0 + (long)iVar13 * 0x38))->m_backend).data +
                     0x20);
            local_b8.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_b8.exp = (((pointer)((long)local_d0 + (long)iVar13 * 0x38))->m_backend).exp;
            local_b8.neg = (((pointer)((long)local_d0 + (long)iVar13 * 0x38))->m_backend).neg;
            local_b8.fpclass =
                 (((pointer)((long)local_d0 + (long)iVar13 * 0x38))->m_backend).fpclass;
            local_b8.prec_elem =
                 (((pointer)((long)local_d0 + (long)iVar13 * 0x38))->m_backend).prec_elem;
            pdVar14 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,*pdVar14,(type *)0x0);
            tVar11 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_b8,&result);
            if (tVar11) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&local_b8,&local_150[iVar13].m_backend);
              local_108.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
              local_108.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
              local_108.data._M_elems[4] = result.m_backend.data._M_elems[4];
              local_108.data._M_elems[5] = result.m_backend.data._M_elems[5];
              local_108.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
              local_108.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
              local_108.data._M_elems[0] = result.m_backend.data._M_elems[0];
              local_108.data._M_elems[1] = result.m_backend.data._M_elems[1];
              local_108.data._M_elems[2] = result.m_backend.data._M_elems[2];
              local_108.data._M_elems[3] = result.m_backend.data._M_elems[3];
              local_108.exp = result.m_backend.exp;
              local_108.neg = result.m_backend.neg;
              local_108.fpclass = result.m_backend.fpclass;
              local_108.prec_elem = result.m_backend.prec_elem;
              result.m_backend.data._M_elems._0_8_ =
                   result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar11 = boost::multiprecision::operator<=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_108,(int *)&result);
              u = local_170;
              if (!tVar11) {
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 10;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems._24_5_ = 0;
                result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&result_1.m_backend,&local_108,(cpp_dec_float<50U,_int,_void> *)local_170
                          );
                u = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&result_1.m_backend;
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.neg = false;
              result.m_backend.exp = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)u,&local_248);
              local_248.data._M_elems[8] = result.m_backend.data._M_elems[8];
              local_248.data._M_elems[9] =
                   (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                                   result.m_backend.data._M_elems._32_5_) >> 0x20);
              local_248.data._M_elems[4] = result.m_backend.data._M_elems[4];
              local_248.data._M_elems[5] = result.m_backend.data._M_elems[5];
              local_248.data._M_elems[6] = result.m_backend.data._M_elems[6];
              local_248.data._M_elems[7] =
                   (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                                   result.m_backend.data._M_elems._24_5_) >> 0x20);
              local_248.data._M_elems[0] = result.m_backend.data._M_elems[0];
              local_248.data._M_elems[1] = result.m_backend.data._M_elems[1];
              local_248.data._M_elems[2] = result.m_backend.data._M_elems[2];
              local_248.data._M_elems[3] = result.m_backend.data._M_elems[3];
              local_248.exp = result.m_backend.exp;
              local_248.neg = result.m_backend.neg;
              local_248.fpclass = result.m_backend.fpclass;
              local_248.prec_elem = result.m_backend.prec_elem;
              tVar11 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_248,&local_148);
              if (tVar11) goto LAB_0027a8ef;
            }
          }
        }
      }
LAB_0027a949:
    }
  }
  else {
    local_1fc = -1;
    (update->thedelta).setupStatus = false;
    local_c0 = (cpp_dec_float<50u,int,void> *)
               (pnVar17 +
               (int)(((long)(update->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_150) / 0x38));
    pnVar2 = &this->epsilon;
    local_180 = &(this->fastDelta).m_backend;
    local_c8 = &(((pointer)local_c8)->m_backend).fpclass;
    local_d0 = &(((pointer)local_d0)->m_backend).fpclass;
    local_160 = 0;
    local_208 = (int *)0x0;
    local_170 = update;
    for (lVar18 = 0;
        this_00 = (cpp_dec_float<50u,int,void> *)((long)&(pnVar17->m_backend).data + lVar18),
        this_00 < local_c0; lVar18 = lVar18 + 0x38) {
      local_248.data._M_elems[8] = (uint)*(undefined8 *)(this_00 + 0x20);
      local_248.data._M_elems[9] = (uint)((ulong)*(undefined8 *)(this_00 + 0x20) >> 0x20);
      local_248.data._M_elems[4] = (uint)*(undefined8 *)(this_00 + 0x10);
      local_248.data._M_elems[5] = (uint)((ulong)*(undefined8 *)(this_00 + 0x10) >> 0x20);
      local_248.data._M_elems[6] = (uint)*(undefined8 *)(this_00 + 0x18);
      local_248.data._M_elems[7] = (uint)((ulong)*(undefined8 *)(this_00 + 0x18) >> 0x20);
      local_248.data._M_elems[0] = (uint)*(undefined8 *)this_00;
      local_248.data._M_elems[1] = (uint)((ulong)*(undefined8 *)this_00 >> 0x20);
      local_248.data._M_elems[2] = (uint)*(undefined8 *)(this_00 + 8);
      local_248.data._M_elems[3] = (uint)((ulong)*(undefined8 *)(this_00 + 8) >> 0x20);
      local_248.exp = *(int *)((long)&(pnVar17->m_backend).data + lVar18 + 0x28);
      local_248.neg = *(bool *)((long)&(pnVar17->m_backend).data + lVar18 + 0x2c);
      local_248._48_8_ = *(ulong *)((long)&(pnVar17->m_backend).data + lVar18 + 0x30);
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      tVar11 = boost::multiprecision::operator!=
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_248,(double *)&result);
      pSVar10 = local_210;
      if (tVar11) {
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
        result.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
        result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.exp = (local_210->epsilon).m_backend.exp;
        result.m_backend.neg = (local_210->epsilon).m_backend.neg;
        result.m_backend.fpclass = (local_210->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (local_210->epsilon).m_backend.prec_elem;
        if (result.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        tVar11 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_248,&result);
        if (tVar11) {
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          result_1.m_backend.data._M_elems[8] = (uint)uVar4;
          result_1.m_backend.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
          result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
          result_1.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
          result_1.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
          result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result_1.m_backend.exp = (pSVar10->epsilon).m_backend.exp;
          result_1.m_backend.neg = (pSVar10->epsilon).m_backend.neg;
          result_1.m_backend.fpclass = (pSVar10->epsilon).m_backend.fpclass;
          result_1.m_backend.prec_elem = (pSVar10->epsilon).m_backend.prec_elem;
          tVar11 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_248,&result_1);
          if (tVar11) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_00,0.0);
            goto LAB_0027b437;
          }
        }
        piVar1 = local_250 + 1;
        *local_250 = (int)local_208;
        local_250 = piVar1;
        if (local_154 == LEAVE) {
          pSVar5 = (local_210->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (local_210->iscoid == true) {
            pDVar15 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar15 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (0 < pSVar5->theRep * pDVar15->data[(long)local_208]) goto LAB_0027b437;
        }
        if ((char)local_174 != '\0') {
          pSVar5 = (local_210->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar6 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < *(int *)((long)&(pSVar6->super_DataKey).info + local_160)) {
            SPxColId::SPxColId((SPxColId *)&result,
                               (SPxId *)((long)&(pSVar6->super_DataKey).info + local_160));
            iVar13 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&result);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar13] == P_FIXED) goto LAB_0027b437;
          }
        }
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
        result.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
        uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
        result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
        result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        result.m_backend.exp = (local_210->epsilon).m_backend.exp;
        result.m_backend.neg = (local_210->epsilon).m_backend.neg;
        result.m_backend.fpclass = (local_210->epsilon).m_backend.fpclass;
        result.m_backend.prec_elem = (local_210->epsilon).m_backend.prec_elem;
        tVar11 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_248,&result);
        if (tVar11) {
          tVar11 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_248,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1b8);
          pcVar16 = &local_1b8;
          if (tVar11) {
            pcVar16 = &local_248;
          }
          uVar4 = *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems;
          uVar7 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems + 2);
          uVar8 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems + 4);
          uVar9 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems + 6);
          local_1b8.data._M_elems[0] = (uint)uVar4;
          local_1b8.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
          local_1b8.data._M_elems[2] = (uint)uVar7;
          local_1b8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
          local_1b8.data._M_elems[4] = (uint)uVar8;
          local_1b8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
          local_1b8.data._M_elems[6] = (uint)uVar9;
          local_1b8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
          uVar4 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar16->data)->data)._M_elems + 8);
          local_1b8.data._M_elems[8] = (uint)uVar4;
          local_1b8.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
          pcVar16 = &local_1b8;
          if (tVar11) {
            pcVar16 = &local_248;
          }
          local_1b8.exp = pcVar16->exp;
          pcVar16 = &local_1b8;
          if (tVar11) {
            pcVar16 = &local_248;
          }
          local_1b8.neg = pcVar16->neg;
          uVar19 = CONCAT44((int)((uint)tVar11 << 0x1f) >> 0x1f,(int)((uint)tVar11 << 0x1f) >> 0x1f)
          ;
          local_1b8._48_8_ = ~uVar19 & local_1b8._48_8_ | local_248._48_8_ & uVar19;
          puVar3 = (uint *)((long)local_c8 + lVar18 + -0x20);
          local_78.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          uVar4 = *(undefined8 *)(puVar3 + 2);
          local_78.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          uVar4 = *(undefined8 *)((long)local_c8 + lVar18 + -0x10);
          local_78.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_78.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          puVar3 = (uint *)((long)local_c8 + lVar18 + -0x30);
          local_78.data._M_elems._0_8_ = *(undefined8 *)puVar3;
          local_78.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
          local_78.exp = *(int *)((long)local_c8 + lVar18 + -8);
          local_78.neg = *(bool *)((long)local_c8 + lVar18 + -4);
          local_78._48_8_ = *(undefined8 *)((long)local_c8 + lVar18);
          pdVar14 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,-*pdVar14,(type *)0x0);
          tVar11 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_78,&result);
          if (tVar11) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&local_78,
                       (cpp_dec_float<50U,_int,_void> *)((long)&local_150->m_backend + lVar18));
            local_108.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
            local_108.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
            local_108.data._M_elems[4] = result.m_backend.data._M_elems[4];
            local_108.data._M_elems[5] = result.m_backend.data._M_elems[5];
            local_108.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
            local_108.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
            local_108.data._M_elems[0] = result.m_backend.data._M_elems[0];
            local_108.data._M_elems[1] = result.m_backend.data._M_elems[1];
            local_108.data._M_elems[2] = result.m_backend.data._M_elems[2];
            local_108.data._M_elems[3] = result.m_backend.data._M_elems[3];
            local_108.exp = result.m_backend.exp;
            local_108.neg = result.m_backend.neg;
            local_108.fpclass = result.m_backend.fpclass;
            local_108.prec_elem = result.m_backend.prec_elem;
            result.m_backend.data._M_elems._0_8_ =
                 result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar11 = boost::multiprecision::operator>=
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_108,(int *)&result);
            if (tVar11) {
              uVar4 = *(undefined8 *)((local_180->data)._M_elems + 8);
              result_1.m_backend.data._M_elems[8] = (uint)uVar4;
              result_1.m_backend.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
              result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_180->data)._M_elems;
              result_1.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((local_180->data)._M_elems + 2);
              result_1.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((local_180->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((local_180->data)._M_elems + 6);
              result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
              result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              result_1.m_backend.exp = (local_210->fastDelta).m_backend.exp;
              result_1.m_backend.neg = (local_210->fastDelta).m_backend.neg;
              result_1.m_backend.fpclass = (local_210->fastDelta).m_backend.fpclass;
              result_1.m_backend.prec_elem = (local_210->fastDelta).m_backend.prec_elem;
              if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
                  result_1.m_backend.data._M_elems[0] != 0) {
                result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
              }
            }
            else {
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems._24_5_ = 0;
              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_1.m_backend,&local_108,local_180);
            }
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.neg = false;
            result.m_backend.exp = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&result_1.m_backend,&local_248);
            local_248.data._M_elems[8] = result.m_backend.data._M_elems[8];
            local_248.data._M_elems[9] =
                 (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                                 result.m_backend.data._M_elems._32_5_) >> 0x20);
            local_248.data._M_elems[4] = result.m_backend.data._M_elems[4];
            local_248.data._M_elems[5] = result.m_backend.data._M_elems[5];
            local_248.data._M_elems[6] = result.m_backend.data._M_elems[6];
            local_248.data._M_elems[7] =
                 (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                                 result.m_backend.data._M_elems._24_5_) >> 0x20);
            local_248.data._M_elems[0] = result.m_backend.data._M_elems[0];
            local_248.data._M_elems[1] = result.m_backend.data._M_elems[1];
            local_248.data._M_elems[2] = result.m_backend.data._M_elems[2];
            local_248.data._M_elems[3] = result.m_backend.data._M_elems[3];
            local_248.exp = result.m_backend.exp;
            local_248.neg = result.m_backend.neg;
            local_248.fpclass = result.m_backend.fpclass;
            local_248.prec_elem = result.m_backend.prec_elem;
            tVar11 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_248,&local_148);
            if (tVar11) {
              local_148.m_backend.data._M_elems[9] = local_248.data._M_elems[9];
              local_148.m_backend.data._M_elems[8] = local_248.data._M_elems[8];
              local_148.m_backend.data._M_elems[1] = local_248.data._M_elems[1];
              local_148.m_backend.data._M_elems[0] = local_248.data._M_elems[0];
              local_148.m_backend.data._M_elems[3] = local_248.data._M_elems[3];
              local_148.m_backend.data._M_elems[2] = local_248.data._M_elems[2];
              local_148.m_backend.data._M_elems[5] = local_248.data._M_elems[5];
              local_148.m_backend.data._M_elems[4] = local_248.data._M_elems[4];
              local_148.m_backend.data._M_elems[7] = local_248.data._M_elems[7];
              local_148.m_backend.data._M_elems[6] = local_248.data._M_elems[6];
              local_148.m_backend.exp = local_248.exp;
              local_148.m_backend.neg = local_248.neg;
              local_148.m_backend.fpclass = local_248.fpclass;
              local_148.m_backend.prec_elem = local_248.prec_elem;
              local_1fc = (int)local_208;
            }
          }
        }
        else {
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          result.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
          result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
          result.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
          result.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar4 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          result.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
          result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          result.m_backend.exp = (local_210->epsilon).m_backend.exp;
          result.m_backend.neg = (local_210->epsilon).m_backend.neg;
          result.m_backend.fpclass = (local_210->epsilon).m_backend.fpclass;
          result.m_backend.prec_elem = (local_210->epsilon).m_backend.prec_elem;
          if (result.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
          }
          tVar11 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_248,&result);
          if (tVar11) {
            result.m_backend.data._M_elems[1] = local_248.data._M_elems[1];
            result.m_backend.data._M_elems[0] = local_248.data._M_elems[0];
            result.m_backend.data._M_elems[3] = local_248.data._M_elems[3];
            result.m_backend.data._M_elems[2] = local_248.data._M_elems[2];
            result.m_backend.data._M_elems[5] = local_248.data._M_elems[5];
            result.m_backend.data._M_elems[4] = local_248.data._M_elems[4];
            result.m_backend.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_248.data._M_elems[9],local_248.data._M_elems[8]),0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_248.data._M_elems[9] >> 8);
            result.m_backend.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_248.data._M_elems[7],local_248.data._M_elems[6]),0);
            result.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_248.data._M_elems[7] >> 8);
            result.m_backend.exp = local_248.exp;
            result.m_backend.neg = local_248.neg;
            result.m_backend.fpclass = local_248.fpclass;
            result.m_backend.prec_elem = local_248.prec_elem;
            if (local_248.fpclass != cpp_dec_float_finite || local_248.data._M_elems[0] != 0) {
              result.m_backend.neg = (bool)(local_248.neg ^ 1);
            }
            tVar11 = boost::multiprecision::operator>
                               (&result,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_1b8);
            if (tVar11) {
              result_1.m_backend.data._M_elems[1] = local_248.data._M_elems[2];
              result_1.m_backend.data._M_elems[0] = local_248.data._M_elems[1];
              result_1.m_backend.data._M_elems[3] = local_248.data._M_elems[4];
              result_1.m_backend.data._M_elems[2] = local_248.data._M_elems[3];
              result_1.m_backend.data._M_elems[5] = local_248.data._M_elems[6];
              result_1.m_backend.data._M_elems[4] = local_248.data._M_elems[5];
              result_1.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_248.data._M_elems[8],local_248.data._M_elems[7]),0);
              result_1.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_248.data._M_elems[8] >> 8);
              result_1.m_backend.data._M_elems[8] = local_248.data._M_elems[9];
              local_1b8.data._M_elems[0] = 0;
              local_1b8.exp = local_248.exp;
              local_1b8.prec_elem = local_248.prec_elem;
              if (local_248.fpclass == cpp_dec_float_finite && local_248.data._M_elems[0] == 0) {
                local_1b8.neg = local_248.neg;
                local_1b8.fpclass = cpp_dec_float_finite;
              }
              else {
                local_1b8.neg = (bool)(local_248.neg ^ 1);
                local_1b8.data._M_elems[0] = local_248.data._M_elems[0];
                local_1b8.fpclass = local_248.fpclass;
              }
            }
            else {
              result_1.m_backend.data._M_elems[1] = local_1b8.data._M_elems[2];
              result_1.m_backend.data._M_elems[0] = local_1b8.data._M_elems[1];
              result_1.m_backend.data._M_elems[3] = local_1b8.data._M_elems[4];
              result_1.m_backend.data._M_elems[2] = local_1b8.data._M_elems[3];
              result_1.m_backend.data._M_elems[5] = local_1b8.data._M_elems[6];
              result_1.m_backend.data._M_elems[4] = local_1b8.data._M_elems[5];
              result_1.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_1b8.data._M_elems[8],local_1b8.data._M_elems[7]),0);
              result_1.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_1b8.data._M_elems[8] >> 8);
              result_1.m_backend.data._M_elems[8] = local_1b8.data._M_elems[9];
              local_1b8.fpclass = local_1b8.fpclass;
            }
            local_1b8.data._M_elems[9] = result_1.m_backend.data._M_elems[8];
            local_1b8.data._M_elems[5] = result_1.m_backend.data._M_elems[4];
            local_1b8.data._M_elems[6] = result_1.m_backend.data._M_elems[5];
            local_1b8.data._M_elems[7] = result_1.m_backend.data._M_elems[6];
            local_1b8.data._M_elems[8] =
                 (uint)(CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                                 result_1.m_backend.data._M_elems._24_5_) >> 0x20);
            local_1b8.data._M_elems[1] = result_1.m_backend.data._M_elems[0];
            local_1b8.data._M_elems[2] = result_1.m_backend.data._M_elems[1];
            local_1b8.data._M_elems[3] = result_1.m_backend.data._M_elems[2];
            local_1b8.data._M_elems[4] = result_1.m_backend.data._M_elems[3];
            puVar3 = (uint *)((long)local_d0 + lVar18 + -0x30);
            local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar3;
            local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
            puVar3 = (uint *)((long)local_d0 + lVar18 + -0x20);
            local_b8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            uVar4 = *(undefined8 *)(puVar3 + 2);
            local_b8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            uVar4 = *(undefined8 *)((long)local_d0 + lVar18 + -0x10);
            local_b8.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_b8.exp = *(int *)((long)local_d0 + lVar18 + -8);
            local_b8.neg = *(bool *)((long)local_d0 + lVar18 + -4);
            local_b8._48_8_ = *(undefined8 *)((long)local_d0 + lVar18);
            pdVar14 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&result.m_backend,*pdVar14,(type *)0x0);
            tVar11 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_b8,&result);
            if (tVar11) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&local_b8,
                         (cpp_dec_float<50U,_int,_void> *)((long)&local_150->m_backend + lVar18));
              local_108.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
              local_108.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
              local_108.data._M_elems[4] = result.m_backend.data._M_elems[4];
              local_108.data._M_elems[5] = result.m_backend.data._M_elems[5];
              local_108.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
              local_108.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
              local_108.data._M_elems[0] = result.m_backend.data._M_elems[0];
              local_108.data._M_elems[1] = result.m_backend.data._M_elems[1];
              local_108.data._M_elems[2] = result.m_backend.data._M_elems[2];
              local_108.data._M_elems[3] = result.m_backend.data._M_elems[3];
              local_108.exp = result.m_backend.exp;
              local_108.neg = result.m_backend.neg;
              local_108.fpclass = result.m_backend.fpclass;
              local_108.prec_elem = result.m_backend.prec_elem;
              result.m_backend.data._M_elems._0_8_ =
                   result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar11 = boost::multiprecision::operator<=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_108,(int *)&result);
              pcVar16 = local_180;
              if (!tVar11) {
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 10;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems._24_5_ = 0;
                result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&result_1.m_backend,&local_108,local_180);
                pcVar16 = &result_1.m_backend;
              }
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.neg = false;
              result.m_backend.exp = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,pcVar16,&local_248);
              local_248.data._M_elems[8] = result.m_backend.data._M_elems[8];
              local_248.data._M_elems[9] =
                   (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                                   result.m_backend.data._M_elems._32_5_) >> 0x20);
              local_248.data._M_elems[4] = result.m_backend.data._M_elems[4];
              local_248.data._M_elems[5] = result.m_backend.data._M_elems[5];
              local_248.data._M_elems[6] = result.m_backend.data._M_elems[6];
              local_248.data._M_elems[7] =
                   (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                                   result.m_backend.data._M_elems._24_5_) >> 0x20);
              local_248.data._M_elems[0] = result.m_backend.data._M_elems[0];
              local_248.data._M_elems[1] = result.m_backend.data._M_elems[1];
              local_248.data._M_elems[2] = result.m_backend.data._M_elems[2];
              local_248.data._M_elems[3] = result.m_backend.data._M_elems[3];
              local_248.exp = result.m_backend.exp;
              local_248.neg = result.m_backend.neg;
              local_248.fpclass = result.m_backend.fpclass;
              local_248.prec_elem = result.m_backend.prec_elem;
              tVar11 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_248,&local_148);
              if (tVar11) {
                local_148.m_backend.data._M_elems[9] = local_248.data._M_elems[9];
                local_148.m_backend.data._M_elems[8] = local_248.data._M_elems[8];
                local_148.m_backend.data._M_elems[1] = local_248.data._M_elems[1];
                local_148.m_backend.data._M_elems[0] = local_248.data._M_elems[0];
                local_148.m_backend.data._M_elems[3] = local_248.data._M_elems[3];
                local_148.m_backend.data._M_elems[2] = local_248.data._M_elems[2];
                local_148.m_backend.data._M_elems[5] = local_248.data._M_elems[5];
                local_148.m_backend.data._M_elems[4] = local_248.data._M_elems[4];
                local_148.m_backend.data._M_elems[7] = local_248.data._M_elems[7];
                local_148.m_backend.data._M_elems[6] = local_248.data._M_elems[6];
                local_148.m_backend.exp = local_248.exp;
                local_148.m_backend.neg = local_248.neg;
                local_148.m_backend.fpclass = local_248.fpclass;
                local_148.m_backend.prec_elem = local_248.prec_elem;
                local_1fc = (int)local_208;
              }
            }
          }
        }
      }
LAB_0027b437:
      local_208 = (int *)((long)local_208 + 1);
      local_160 = local_160 + 8;
    }
    (local_170->thedelta).super_IdxSet.num =
         (int)((ulong)((long)local_250 - (long)(local_170->thedelta).super_IdxSet.idx) >> 2);
    (local_170->thedelta).setupStatus = true;
  }
  *(undefined8 *)((local_40->m_backend).data._M_elems + 8) =
       local_148.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 4) =
       local_148.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 6) =
       local_148.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(local_40->m_backend).data._M_elems = local_148.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 2) = local_148.m_backend.data._M_elems._8_8_
  ;
  (local_40->m_backend).exp = local_148.m_backend.exp;
  (local_40->m_backend).neg = local_148.m_backend.neg;
  (local_40->m_backend).fpclass = local_148.m_backend.fpclass;
  (local_40->m_backend).prec_elem = local_148.m_backend.prec_elem;
  *(ulong *)((local_38->m_backend).data._M_elems + 8) =
       CONCAT44(local_1b8.data._M_elems[9],local_1b8.data._M_elems[8]);
  *(ulong *)((local_38->m_backend).data._M_elems + 4) =
       CONCAT44(local_1b8.data._M_elems[5],local_1b8.data._M_elems[4]);
  *(ulong *)((local_38->m_backend).data._M_elems + 6) =
       CONCAT44(local_1b8.data._M_elems[7],local_1b8.data._M_elems[6]);
  *(ulong *)(local_38->m_backend).data._M_elems =
       CONCAT44(local_1b8.data._M_elems[1],local_1b8.data._M_elems[0]);
  *(ulong *)((local_38->m_backend).data._M_elems + 2) =
       CONCAT44(local_1b8.data._M_elems[3],local_1b8.data._M_elems[2]);
  (local_38->m_backend).exp = local_1b8.exp;
  (local_38->m_backend).neg = local_1b8.neg;
  (local_38->m_backend).fpclass = local_1b8.fpclass;
  (local_38->m_backend).prec_elem = local_1b8.prec_elem;
  return local_1fc;
}

Assistant:

int SPxFastRT<R>::minDelta(
   R& val,
   R& maxabs,
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = (this->m_type == SPxSolverBase<R>::LEAVE);
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;
         x = upd[i];

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse VectorBase<R> update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;


            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;

   return sel;
}